

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O3

void __thiscall
UnscentedKalmanFilter::UpdateState
          (UnscentedKalmanFilter *this,VectorXd *z,VectorXd *z_pred,MatrixXd *S,MatrixXd *Xsig_pred,
          MatrixXd *Zsig,VectorXd *x,MatrixXd *P)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  DenseStorage<double,__1,__1,__1,_0> *pDVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  undefined1 auVar9 [16];
  double dVar10;
  Index size;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  ostream *poVar11;
  undefined8 *puVar12;
  long lVar13;
  DenseStorage<double,__1,__1,__1,_0> *pDVar14;
  ulong uVar15;
  char *pcVar16;
  long nbRows;
  MatrixXd K;
  VectorXd z_diff;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> es;
  VectorXd x_diff;
  DenseStorage<double,__1,__1,__1,_0> local_1c8;
  DenseStorage<double,__1,__1,__1,_0> *local_1a8;
  GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
  local_1a0;
  DenseStorage<double,__1,__1,__1,_0> local_178;
  DenseStorage<double,__1,__1,__1,_0> *local_160;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_158;
  undefined1 local_150 [16];
  undefined1 local_140 [24];
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDStack_128;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_120;
  DenseStorage<double,__1,__1,__1,_0> *local_118;
  double *local_110;
  double *local_f8;
  double *local_e0;
  double *local_d0;
  double *local_b8;
  double *local_a8;
  double *local_80;
  double *local_68;
  DenseStorage<double,__1,__1,__1,_0> *local_58;
  DenseStorage<double,__1,__1,__1,_0> local_50;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_38;
  
  uVar2 = (uint)(z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
  uVar3 = (uint)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  local_1c8.m_data = (double *)0x0;
  local_1c8.m_rows = 0;
  local_1c8.m_cols = 0;
  nbRows = (long)(int)uVar3;
  lVar13 = (long)(int)uVar2;
  local_1a8 = (DenseStorage<double,__1,__1,__1,_0> *)z_pred;
  local_160 = (DenseStorage<double,__1,__1,__1,_0> *)z;
  if ((long)(int)(uVar3 | uVar2) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((uVar2 != 0 && uVar3 != 0) &&
     (auVar9 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar9 / SEXT816(lVar13),0) < nbRows)) {
    puVar12 = (undefined8 *)
              __cxa_allocate_exception
                        (8,(long)(int)(uVar3 | uVar2),SUB168(auVar9 % SEXT816(lVar13),0));
    *puVar12 = operator_delete;
    __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1c8,nbRows * lVar13,nbRows,lVar13);
  local_140._0_8_ = local_1c8.m_rows;
  local_140._8_8_ = local_1c8.m_cols;
  local_140._16_8_ = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
  local_58 = (DenseStorage<double,__1,__1,__1,_0> *)S;
  if ((local_1c8.m_cols | local_1c8.m_rows) < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  local_158 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Zsig;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1c8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_140);
  if (0 < this->n_sigma_) {
    lVar13 = 0;
    do {
      pDVar4 = *(DenseStorage<double,__1,__1,__1,_0> **)(local_158 + 8);
      pDVar14 = (DenseStorage<double,__1,__1,__1,_0> *)
                ((long)pDVar4 * lVar13 * 8 + *(long *)local_158);
      if ((long)pDVar4 < 0 && pDVar14 != (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
LAB_0011e056:
        __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                      ,0x94,
                      "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                     );
      }
      if (*(long *)(local_158 + 0x10) <= lVar13) {
LAB_0011e037:
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                      ,0x76,
                      "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                     );
      }
      pDStack_128 = local_158;
      local_118 = local_1a8;
      local_140._0_8_ = pDVar14;
      pDStack_120 = pDVar4;
      if (pDVar4 != (DenseStorage<double,__1,__1,__1,_0> *)local_1a8->m_rows) {
LAB_0011e020:
        pcVar16 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
        local_140._8_8_ = pDStack_120;
        goto LAB_0011e08a;
      }
      local_140._8_8_ = pDVar4;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_178,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_140);
      (*this->current_sensor_->_vptr_Sensor[3])(this->current_sensor_,&local_178);
      pDVar4 = (DenseStorage<double,__1,__1,__1,_0> *)
               (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_rows;
      pDVar14 = (DenseStorage<double,__1,__1,__1,_0> *)
                ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data + (long)pDVar4 * lVar13);
      if ((long)pDVar4 < 0 && pDVar14 != (DenseStorage<double,__1,__1,__1,_0> *)0x0)
      goto LAB_0011e056;
      if ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols <= lVar13) goto LAB_0011e037;
      local_118 = (DenseStorage<double,__1,__1,__1,_0> *)x;
      local_140._0_8_ = pDVar14;
      pDStack_128 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Xsig_pred;
      pDStack_120 = pDVar4;
      if (pDVar4 != (DenseStorage<double,__1,__1,__1,_0> *)
                    (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows) goto LAB_0011e020;
      local_140._8_8_ = pDVar4;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_50,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_140);
      NormalizeState(this,(VectorXd *)&local_50);
      if ((this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= lVar13) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xad,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      local_140._8_8_ =
           (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data[lVar13];
      pDStack_128 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x0;
      pDStack_120 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_118 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_1a0.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_lhs = (LhsNested)&local_1c8;
      local_140._0_8_ = &local_50;
      local_140._16_8_ = &local_178;
      local_1a0.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_rhs = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_140);
      if (((DenseStorage<double,__1,__1,__1,_0> *)local_1c8.m_rows !=
           *(DenseStorage<double,__1,__1,__1,_0> **)(local_140._0_8_ + 8)) ||
         ((DenseStorage<double,__1,__1,__1,_0> *)local_1c8.m_cols !=
          *(DenseStorage<double,__1,__1,__1,_0> **)(local_140._16_8_ + 8))) {
        pcVar16 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
        ;
        goto LAB_0011e08a;
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1c8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                  *)&local_1a0);
      free(pDStack_128);
      free(local_50.m_data);
      free(local_178.m_data);
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->n_sigma_);
  }
  pDVar4 = local_58;
  if (local_58->m_rows != local_58->m_cols) goto LAB_0011e0ca;
  local_1a0.
  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_lhs = (LhsNested)local_58;
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)local_140,(Matrix<double,__1,__1,_0,__1,__1> *)&local_1c8,
                (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)&local_1a0);
  other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
          Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_140);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_178,*(long *)(other + 0x10) * *(long *)(other + 8),*(long *)(other + 8),
             *(long *)(other + 0x10));
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_178,other);
  free(pDStack_120);
  free((void *)local_140._8_8_);
  local_140._0_8_ = local_160;
  local_140._8_8_ = local_1a8;
  if (local_160->m_rows == local_1a8->m_rows) {
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,_1,1,0,_1,1> *)local_150,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_140);
    (*this->current_sensor_->_vptr_Sensor[3])
              (this->current_sensor_,(DenseStorage<double,__1,__1,__1,_0> *)local_150);
    local_140._16_8_ = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
    pDStack_128 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x0;
    local_140._0_8_ = &local_178;
    local_140._8_8_ = (DenseStorage<double,__1,__1,__1,_0> *)local_150;
    if (local_178.m_cols != local_150._8_8_) {
      pcVar16 = 
      "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>]"
      ;
LAB_0011e1a6:
      __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/ProductBase.h"
                    ,0x66,pcVar16);
    }
    local_1a0.
    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_lhs = (LhsNested)x;
    local_1a0.
    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_rhs = (RhsNested)Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_140);
    if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
        *(DenseIndex *)(local_140._0_8_ + 8)) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)x,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>_>
                  *)&local_1a0);
      uVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if (uVar5 != *(DenseIndex *)
                    ((long)local_1a0.
                           super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_rhs + 8)) {
        __assert_fail("rows() == other.rows() && cols() == other.cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                      ,0x1f9,
                      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>]"
                     );
      }
      uVar15 = uVar5 - ((long)uVar5 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar5) {
        lVar13 = 0;
        do {
          dVar10 = (*(double **)
                     &(local_1a0.
                       super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      .m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                   lVar13)[1];
          pdVar6 = ((local_1a0.
                     super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data + lVar13;
          dVar1 = pdVar6[1];
          pdVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data + lVar13;
          *pdVar7 = (*(double **)
                      &(local_1a0.
                        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                    [lVar13] + *pdVar6;
          pdVar7[1] = dVar10 + dVar1;
          lVar13 = lVar13 + 2;
        } while (lVar13 < (long)uVar15);
      }
      if ((long)uVar15 < (long)uVar5) {
        pdVar6 = *(double **)
                  &(local_1a0.
                    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   .m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
        pdVar7 = ((local_1a0.
                   super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        pdVar8 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        do {
          pdVar8[uVar15] = pdVar6[uVar15] + pdVar7[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar5 != uVar15);
      }
      free((void *)local_140._16_8_);
      NormalizeState(this,x);
      local_1a0.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_rhs = (RhsNested)pDVar4;
      local_1a0.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_1a0.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      local_1a0.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           0;
      local_1a0.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_lhs = (LhsNested)&local_178;
      if (local_178.m_cols != pDVar4->m_rows) {
        pcVar16 = 
        "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>]"
        ;
        goto LAB_0011e1a6;
      }
      local_38.m_matrix = (Nested)&local_178;
      Eigen::
      ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)local_140,&local_1a0,&local_38);
      local_50.m_data = (double *)P;
      local_50.m_rows =
           (DenseIndex)Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_140);
      if (((P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
           *(DenseIndex *)(local_140._0_8_ + 8)) &&
         ((P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
          (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140._8_8_)->
          m_storage).m_rows)) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,5>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)P,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>_>
                    *)&local_50);
        free((void *)local_140._16_8_);
        free(local_1a0.
             super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        if (this->debug_ < 2) {
LAB_0011dff1:
          free((void *)local_150._0_8_);
          free(local_178.m_data);
          free(local_1c8.m_data);
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Update done:",0xc)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"z:\n",3);
        local_140._0_8_ = local_160;
        poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                    (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)local_140);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"z_pred:\n",8);
        local_140._0_8_ = local_1a8;
        poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                    (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)local_140);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) &
             0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Xsig_pred:\n",0xb)
        ;
        poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                    (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                    Xsig_pred);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Zsig:\n",6);
        poVar11 = Eigen::operator<<((ostream *)&std::cout,local_158);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Tc:\n",4);
        poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                    (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                    &local_1c8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S:\n",3);
        poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                    (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pDVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S inverse:\n",0xb)
        ;
        if (pDVar4->m_rows == pDVar4->m_cols) {
          local_140._0_8_ = pDVar4;
          poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                      (DenseBase<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                                       *)local_140);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"K:\n",3);
          poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                      (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                      &local_178);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"K transpose:\n",0xd);
          local_140._0_8_ = &local_178;
          poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                      (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)local_140);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P:\n",3);
          poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                      (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)P);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"P inverse:\n",0xb);
          if ((P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
              == (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_cols) {
            local_140._0_8_ = P;
            poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                        (DenseBase<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                                         *)local_140);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x:\n",3);
            local_140._0_8_ = x;
            poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                        (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         *)local_140);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::EigenSolver
                      ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140,P,true);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Eigenvalues of P:\n",0x12);
            if (local_118._0_1_ == false) {
              __assert_fail("m_isInitialized && \"EigenSolver is not initialized.\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Eigenvalues/EigenSolver.h"
                            ,0xf5,
                            "const EigenvalueType &Eigen::EigenSolver<Eigen::Matrix<double, -1, -1>>::eigenvalues() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                           );
            }
            poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                        (DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
                                         *)&pDStack_128);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            free(local_68);
            free(local_80);
            free(local_a8);
            free(local_b8);
            free(local_d0);
            free(local_e0);
            free(local_f8);
            free(local_110);
            free(pDStack_128);
            free((void *)local_140._0_8_);
            goto LAB_0011dff1;
          }
        }
LAB_0011e0ca:
        __assert_fail("rows() == cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/LU/Inverse.h"
                      ,0x143,
                      "const internal::inverse_impl<Derived> Eigen::MatrixBase<Eigen::Matrix<double, -1, -1>>::inverse() const [Derived = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      pcVar16 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>]"
      ;
    }
    else {
      pcVar16 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>]"
      ;
    }
  }
  else {
    pcVar16 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
  }
LAB_0011e08a:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x84,pcVar16);
}

Assistant:

void UnscentedKalmanFilter::UpdateState(const VectorXd &z, const VectorXd &z_pred, const MatrixXd &S, 
		const MatrixXd &Xsig_pred, const MatrixXd &Zsig, VectorXd &x, MatrixXd &P) const {

   int n_z = z_pred.rows();	
   int n_x = x.rows();

   // calculate cross correlation matrix
   MatrixXd Tc(n_x, n_z);

   Tc.fill(0.0);

   for (int i=0; i<n_sigma_; i++) {  // 2n+1 sigma points

       // residual
       VectorXd z_diff = Zsig.col(i) - z_pred;
       current_sensor_->NormalizeMeasurement(z_diff);

       // state difference
       VectorXd x_diff = Xsig_pred.col(i) - x;
       NormalizeState(x_diff);

       Tc = Tc + weights_c_(i) * x_diff * z_diff.transpose();
   }

   // Kalman gain K;
   MatrixXd K = Tc * S.inverse();

   // residual
   VectorXd z_diff = z - z_pred;
   current_sensor_->NormalizeMeasurement(z_diff);

   // update state mean and covariance matrix
   x = x + K * z_diff;
   NormalizeState(x);
   P = P - K*S*K.transpose();

   if (debug_ > 1) {
       std::cout << "Update done:" << endl;
       std::cout << "z:\n" << z.transpose() << std::endl;
       std::cout << "z_pred:\n" << z_pred.transpose() << std::endl;
       std::cout << std::fixed << "Xsig_pred:\n" << Xsig_pred << std::endl;
       std::cout << "Zsig:\n" << Zsig << std::endl;
       std::cout << "Tc:\n" << Tc << std::endl;
       std::cout << "S:\n" << S << std::endl;
       std::cout << "S inverse:\n" << S.inverse() << std::endl;
       std::cout << "K:\n" << K << std::endl;
       std::cout << "K transpose:\n" << K.transpose() << std::endl;
       std::cout << "P:\n" << P << std::endl;
       std::cout << "P inverse:\n" << P.inverse() << std::endl;
       std::cout << "x:\n" << x.transpose() << std::endl;
       Eigen::EigenSolver<MatrixXd> es(P);
       cout << "Eigenvalues of P:\n" << es.eigenvalues() << endl;
    }
}